

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  void *in_RDX;
  int in_EDI;
  long in_R8;
  int i;
  secp256k1_ge d_ge;
  secp256k1_gej ai;
  secp256k1_gej d;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar1;
  secp256k1_gej *in_stack_fffffffffffffe80;
  secp256k1_fe *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_fffffffffffffec8;
  secp256k1_ge *in_stack_fffffffffffffed0;
  undefined1 auStack_d8 [128];
  undefined1 auStack_58 [48];
  long local_28;
  void *local_18;
  int local_4;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_4 = in_EDI;
  secp256k1_gej_double_var
            (in_stack_fffffffffffffe80,
             (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (secp256k1_fe *)0x487b37);
  secp256k1_ge_set_xy((secp256k1_ge *)in_stack_fffffffffffffe80,
                      (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (secp256k1_fe *)0x487b55);
  secp256k1_ge_set_gej_zinv
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  secp256k1_gej_set_ge
            (in_stack_fffffffffffffe80,
             (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  memcpy(auStack_d8,(void *)(local_28 + 0x50),0x28);
  memcpy(local_18,auStack_58,0x28);
  for (iVar1 = 1; iVar1 < local_4; iVar1 = iVar1 + 1) {
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)d_ge.x.n[3],(secp256k1_gej *)d_ge.x.n[2],(secp256k1_ge *)d_ge.x.n[1]
               ,(secp256k1_fe *)d_ge.x.n[0]);
    secp256k1_ge_set_xy((secp256k1_ge *)in_stack_fffffffffffffe80,
                        (secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe78),
                        (secp256k1_fe *)0x487c27);
  }
  secp256k1_fe_impl_mul
            (&in_stack_fffffffffffffe80->x,(secp256k1_fe *)CONCAT44(iVar1,in_stack_fffffffffffffe78)
             ,(secp256k1_fe *)0x487c56);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}